

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

void __thiscall
gl4cts::EnhancedLayouts::XFBExceedOffsetLimitTest::testInit(XFBExceedOffsetLimitTest *this)

{
  pointer *pptVar1;
  iterator __position;
  testCase tVar2;
  GLuint c;
  CASES CVar3;
  GLuint stage;
  STAGES SVar4;
  testCase test_case;
  testCase local_30;
  
  CVar3 = BLOCK;
  do {
    SVar4 = COMPUTE;
    do {
      if (SVar4 != FRAGMENT && (SVar4 & FRAGMENT) != COMPUTE) {
        __position._M_current =
             (this->m_test_cases).
             super__Vector_base<gl4cts::EnhancedLayouts::XFBExceedOffsetLimitTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBExceedOffsetLimitTest::testCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_test_cases).
            super__Vector_base<gl4cts::EnhancedLayouts::XFBExceedOffsetLimitTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBExceedOffsetLimitTest::testCase>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_30.m_case = CVar3;
          local_30.m_stage = SVar4;
          std::
          vector<gl4cts::EnhancedLayouts::XFBExceedOffsetLimitTest::testCase,std::allocator<gl4cts::EnhancedLayouts::XFBExceedOffsetLimitTest::testCase>>
          ::_M_realloc_insert<gl4cts::EnhancedLayouts::XFBExceedOffsetLimitTest::testCase_const&>
                    ((vector<gl4cts::EnhancedLayouts::XFBExceedOffsetLimitTest::testCase,std::allocator<gl4cts::EnhancedLayouts::XFBExceedOffsetLimitTest::testCase>>
                      *)&this->m_test_cases,__position,&local_30);
        }
        else {
          tVar2.m_stage = SVar4;
          tVar2.m_case = CVar3;
          *__position._M_current = tVar2;
          pptVar1 = &(this->m_test_cases).
                     super__Vector_base<gl4cts::EnhancedLayouts::XFBExceedOffsetLimitTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBExceedOffsetLimitTest::testCase>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pptVar1 = *pptVar1 + 1;
        }
      }
      SVar4 = SVar4 + VERTEX;
    } while (SVar4 != STAGE_MAX);
    CVar3 = CVar3 + GLOBAL;
  } while (CVar3 != CASE_MAX);
  return;
}

Assistant:

void XFBExceedOffsetLimitTest::testInit()
{
	for (GLuint c = 0; c < CASE_MAX; ++c)
	{
		for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
		{
			if ((Utils::Shader::COMPUTE == stage) || (Utils::Shader::TESS_CTRL == stage) ||
				(Utils::Shader::FRAGMENT == stage))
			{
				continue;
			}

			testCase test_case = { (CASES)c, (Utils::Shader::STAGES)stage };

			m_test_cases.push_back(test_case);
		}
	}
}